

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::valid_alias_name_string(string *str)

{
  int iVar1;
  long lVar2;
  string *in_RDI;
  char in_stack_ffffffffffffffc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  allocator local_29;
  string local_28 [32];
  string *local_8;
  
  local_8 = in_RDI;
  if (valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&valid_alias_name_string(std::__cxx11::string_const&)::
                                 badChars_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_28,"\n",&local_29);
      ::std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
      ::std::__cxx11::string::~string(local_28);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_
                         );
    }
  }
  lVar2 = ::std::__cxx11::string::find_first_of(local_8,0x1b7e50);
  return lVar2 == -1;
}

Assistant:

inline bool valid_alias_name_string(const std::string &str) {
    static const std::string badChars(std::string("\n") + '\0');
    return (str.find_first_of(badChars) == std::string::npos);
}